

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
AbstractModuleClient::getAvailableTrodesData
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,AbstractModuleClient *this,string *data)

{
  unsigned_long __val;
  _func_int **pp_Var1;
  long *plVar2;
  NTrodeObj *pNVar3;
  bool bVar4;
  undefined8 uVar5;
  pointer pNVar6;
  char cVar7;
  int iVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  NTrodeObj *pNVar12;
  unsigned_long uVar13;
  NDevice *dv;
  pointer pNVar14;
  NDeviceChannel *ch;
  pointer pNVar15;
  char cVar16;
  vector<NDevice,_std::allocator<NDevice>_> *this_00;
  _func_int **pp_Var17;
  undefined8 uVar18;
  ulong uVar19;
  string __str;
  undefined1 local_110 [56];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d8;
  undefined1 local_d0 [32];
  string local_b0;
  NDevice *local_90;
  undefined1 local_88 [32];
  vector<NDevice,_std::allocator<NDevice>_> local_68;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> local_50;
  NDevice *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  iVar8 = std::__cxx11::string::compare((char *)data);
  if (iVar8 == 0) {
    plVar2 = (long *)(local_110 + 0x10);
    local_110._0_8_ = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"Format: \'ntrode_id, nth channel\'","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_110);
    if ((long *)local_110._0_8_ != plVar2) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    MlmWrap::getTrodesConfig((TrodesConfig *)local_110,&this->super_MlmWrap);
    TrodesConfig::getNTrodes
              ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_68,(TrodesConfig *)local_110)
    ;
    TrodesConfig::~TrodesConfig((TrodesConfig *)local_110);
    local_38 = local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_90 = local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar3 = (NTrodeObj *)(local_d0 + 0x10);
      do {
        uVar19 = 0;
        while( true ) {
          NTrodeObj::getHw_chans
                    ((vector<int,_std::allocator<int>_> *)local_110,(NTrodeObj *)local_90);
          uVar5 = local_110._8_8_;
          uVar18 = local_110._0_8_;
          if ((long *)local_110._0_8_ != (long *)0x0) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ - local_110._0_8_);
          }
          if ((ulong)((long)(uVar5 - uVar18) >> 2) <= uVar19) break;
          NTrodeObj::getId_abi_cxx11_((string *)local_88,(NTrodeObj *)local_90);
          plVar10 = (long *)std::__cxx11::string::append((char *)local_88);
          pNVar12 = (NTrodeObj *)(plVar10 + 2);
          if ((NTrodeObj *)*plVar10 == pNVar12) {
            local_d0._16_8_ = (pNVar12->super_NetworkDataType)._vptr_NetworkDataType;
            local_d0._24_8_ = plVar10[3];
            local_d0._0_8_ = pNVar3;
          }
          else {
            local_d0._16_8_ = (pNVar12->super_NetworkDataType)._vptr_NetworkDataType;
            local_d0._0_8_ = (NTrodeObj *)*plVar10;
          }
          local_d0._8_8_ = plVar10[1];
          *plVar10 = (long)pNVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          __val = uVar19 + 1;
          cVar16 = '\x01';
          if (8 < uVar19) {
            uVar13 = __val;
            cVar7 = '\x04';
            do {
              cVar16 = cVar7;
              if (uVar13 < 100) {
                cVar16 = cVar16 + -2;
                goto LAB_001fa807;
              }
              if (uVar13 < 1000) {
                cVar16 = cVar16 + -1;
                goto LAB_001fa807;
              }
              if (uVar13 < 10000) goto LAB_001fa807;
              bVar4 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar7 = cVar16 + '\x04';
            } while (bVar4);
            cVar16 = cVar16 + '\x01';
          }
LAB_001fa807:
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_b0,cVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_b0._M_dataplus._M_p,(uint)local_b0._M_string_length,__val);
          pp_Var17 = (_func_int **)0xf;
          if ((NTrodeObj *)local_d0._0_8_ != pNVar3) {
            pp_Var17 = (_func_int **)local_d0._16_8_;
          }
          pp_Var1 = (_func_int **)
                    ((long)&((NetworkDataType *)local_d0._8_8_)->_vptr_NetworkDataType +
                    CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length));
          if (pp_Var17 < pp_Var1) {
            uVar18 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              uVar18 = local_b0.field_2._0_8_;
            }
            if ((ulong)uVar18 < pp_Var1) goto LAB_001fa875;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,local_d0._0_8_);
          }
          else {
LAB_001fa875:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_d0,(ulong)local_b0._M_dataplus._M_p);
          }
          psVar11 = puVar9 + 2;
          if ((size_type *)*puVar9 == psVar11) {
            local_110._16_8_ = *psVar11;
            local_110._24_8_ = puVar9[3];
            local_110._0_8_ = plVar2;
          }
          else {
            local_110._16_8_ = *psVar11;
            local_110._0_8_ = (size_type *)*puVar9;
          }
          local_110._8_8_ = puVar9[1];
          *puVar9 = psVar11;
          puVar9[1] = 0;
          *(undefined1 *)psVar11 = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110);
          if ((long *)local_110._0_8_ != plVar2) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._0_8_ + 1);
          }
          if ((NTrodeObj *)local_d0._0_8_ != pNVar3) {
            operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
          }
          uVar19 = __val;
          if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
            operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
          }
        }
        local_90 = local_90 + 1;
      } while (local_90 != local_38);
    }
    this_00 = &local_68;
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)data);
    if (iVar8 != 0) {
      iVar8 = std::__cxx11::string::compare((char *)data);
      if (iVar8 == 0) {
        plVar2 = (long *)(local_110 + 0x10);
        local_110._0_8_ = plVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,"Format: \'Device_name, channel_id\'","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110);
        if ((long *)local_110._0_8_ != plVar2) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        MlmWrap::getTrodesConfig((TrodesConfig *)local_110,&this->super_MlmWrap);
        TrodesConfig::getDevices(&local_68,(TrodesConfig *)local_110);
        TrodesConfig::~TrodesConfig((TrodesConfig *)local_110);
        local_90 = local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pNVar3 = (NTrodeObj *)(local_d0 + 0x10);
          pNVar14 = local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            NDevice::getChannels(&local_50,pNVar14);
            pNVar6 = local_50.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (pNVar15 = local_50.
                           super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                           _M_impl.super__Vector_impl_data._M_start; pNVar15 != pNVar6;
                pNVar15 = pNVar15 + 1) {
              iVar8 = NDeviceChannel::getType(pNVar15);
              if (iVar8 == 1) {
                NDevice::getName_abi_cxx11_((string *)local_88,pNVar14);
                plVar10 = (long *)std::__cxx11::string::append((char *)local_88);
                pNVar12 = (NTrodeObj *)(plVar10 + 2);
                if ((NTrodeObj *)*plVar10 == pNVar12) {
                  local_d0._16_8_ = (pNVar12->super_NetworkDataType)._vptr_NetworkDataType;
                  local_d0._24_8_ = plVar10[3];
                  local_d0._0_8_ = pNVar3;
                }
                else {
                  local_d0._16_8_ = (pNVar12->super_NetworkDataType)._vptr_NetworkDataType;
                  local_d0._0_8_ = (NTrodeObj *)*plVar10;
                }
                local_d0._8_8_ = plVar10[1];
                *plVar10 = (long)pNVar12;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                NDeviceChannel::getId_abi_cxx11_(&local_b0,pNVar15);
                pp_Var17 = (_func_int **)0xf;
                if ((NTrodeObj *)local_d0._0_8_ != pNVar3) {
                  pp_Var17 = (_func_int **)local_d0._16_8_;
                }
                pp_Var1 = (_func_int **)
                          ((long)&((NetworkDataType *)local_d0._8_8_)->_vptr_NetworkDataType +
                          CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length))
                ;
                if (pp_Var17 < pp_Var1) {
                  uVar18 = (_func_int **)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    uVar18 = local_b0.field_2._0_8_;
                  }
                  if ((ulong)uVar18 < pp_Var1) goto LAB_001fabda;
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_b0,0,(char *)0x0,local_d0._0_8_);
                }
                else {
LAB_001fabda:
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     (local_d0,(ulong)local_b0._M_dataplus._M_p);
                }
                psVar11 = puVar9 + 2;
                if ((size_type *)*puVar9 == psVar11) {
                  local_110._16_8_ = *psVar11;
                  local_110._24_8_ = puVar9[3];
                  local_110._0_8_ = plVar2;
                }
                else {
                  local_110._16_8_ = *psVar11;
                  local_110._0_8_ = (size_type *)*puVar9;
                }
                local_110._8_8_ = puVar9[1];
                *puVar9 = psVar11;
                puVar9[1] = 0;
                *(undefined1 *)psVar11 = 0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_110);
                if ((long *)local_110._0_8_ != plVar2) {
                  operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._0_8_ + 1);
                }
                if ((NTrodeObj *)local_d0._0_8_ != pNVar3) {
                  operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
                }
                if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
                  operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
                }
              }
            }
            std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector(&local_50);
            pNVar14 = pNVar14 + 1;
          } while (pNVar14 != local_90);
        }
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)data);
        if (iVar8 != 0) {
          iVar8 = std::__cxx11::string::compare((char *)data);
          if (iVar8 != 0) {
            return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d8;
          }
          plVar2 = (long *)(local_110 + 0x10);
          local_110._0_8_ = plVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_110,"Format: \'ntrode_id, cluster\'","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110);
          if ((long *)local_110._0_8_ != plVar2) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          MlmWrap::getTrodesConfig((TrodesConfig *)local_110,&this->super_MlmWrap);
          TrodesConfig::getNTrodes
                    ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)local_88,
                     (TrodesConfig *)local_110);
          TrodesConfig::~TrodesConfig((TrodesConfig *)local_110);
          if (local_88._0_8_ != local_88._8_8_) {
            pNVar14 = (pointer)local_88._0_8_;
            do {
              NTrodeObj::getId_abi_cxx11_((string *)local_d0,(NTrodeObj *)pNVar14);
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_d0);
              psVar11 = puVar9 + 2;
              if ((size_type *)*puVar9 == psVar11) {
                local_110._16_8_ = *psVar11;
                local_110._24_8_ = puVar9[3];
                local_110._0_8_ = plVar2;
              }
              else {
                local_110._16_8_ = *psVar11;
                local_110._0_8_ = (size_type *)*puVar9;
              }
              local_110._8_8_ = puVar9[1];
              *puVar9 = psVar11;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_110);
              if ((long *)local_110._0_8_ != plVar2) {
                operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
              }
              if ((NTrodeObj *)local_d0._0_8_ != (NTrodeObj *)(local_d0 + 0x10)) {
                operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
              }
              pNVar14 = pNVar14 + 1;
            } while (pNVar14 != (pointer)local_88._8_8_);
          }
          this_00 = (vector<NDevice,_std::allocator<NDevice>_> *)local_88;
          goto LAB_001faa46;
        }
        plVar2 = (long *)(local_110 + 0x10);
        local_110._0_8_ = plVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,"Format: \'Device_name, channel_id\'","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110);
        if ((long *)local_110._0_8_ != plVar2) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        MlmWrap::getTrodesConfig((TrodesConfig *)local_110,&this->super_MlmWrap);
        TrodesConfig::getDevices(&local_68,(TrodesConfig *)local_110);
        TrodesConfig::~TrodesConfig((TrodesConfig *)local_110);
        local_90 = local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pNVar3 = (NTrodeObj *)(local_d0 + 0x10);
          pNVar14 = local_68.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            NDevice::getChannels(&local_50,pNVar14);
            pNVar6 = local_50.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (pNVar15 = local_50.
                           super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                           _M_impl.super__Vector_impl_data._M_start; pNVar15 != pNVar6;
                pNVar15 = pNVar15 + 1) {
              iVar8 = NDeviceChannel::getType(pNVar15);
              if (iVar8 == 0) {
                NDevice::getName_abi_cxx11_((string *)local_88,pNVar14);
                plVar10 = (long *)std::__cxx11::string::append((char *)local_88);
                pNVar12 = (NTrodeObj *)(plVar10 + 2);
                if ((NTrodeObj *)*plVar10 == pNVar12) {
                  local_d0._16_8_ = (pNVar12->super_NetworkDataType)._vptr_NetworkDataType;
                  local_d0._24_8_ = plVar10[3];
                  local_d0._0_8_ = pNVar3;
                }
                else {
                  local_d0._16_8_ = (pNVar12->super_NetworkDataType)._vptr_NetworkDataType;
                  local_d0._0_8_ = (NTrodeObj *)*plVar10;
                }
                local_d0._8_8_ = plVar10[1];
                *plVar10 = (long)pNVar12;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                NDeviceChannel::getId_abi_cxx11_(&local_b0,pNVar15);
                pp_Var17 = (_func_int **)0xf;
                if ((NTrodeObj *)local_d0._0_8_ != pNVar3) {
                  pp_Var17 = (_func_int **)local_d0._16_8_;
                }
                pp_Var1 = (_func_int **)
                          ((long)&((NetworkDataType *)local_d0._8_8_)->_vptr_NetworkDataType +
                          CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length))
                ;
                if (pp_Var17 < pp_Var1) {
                  uVar18 = (_func_int **)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    uVar18 = local_b0.field_2._0_8_;
                  }
                  if ((ulong)uVar18 < pp_Var1) goto LAB_001fae70;
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_b0,0,(char *)0x0,local_d0._0_8_);
                }
                else {
LAB_001fae70:
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     (local_d0,(ulong)local_b0._M_dataplus._M_p);
                }
                psVar11 = puVar9 + 2;
                if ((size_type *)*puVar9 == psVar11) {
                  local_110._16_8_ = *psVar11;
                  local_110._24_8_ = puVar9[3];
                  local_110._0_8_ = plVar2;
                }
                else {
                  local_110._16_8_ = *psVar11;
                  local_110._0_8_ = (size_type *)*puVar9;
                }
                local_110._8_8_ = puVar9[1];
                *puVar9 = psVar11;
                puVar9[1] = 0;
                *(undefined1 *)psVar11 = 0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_110);
                if ((long *)local_110._0_8_ != plVar2) {
                  operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._0_8_ + 1);
                }
                if ((NTrodeObj *)local_d0._0_8_ != pNVar3) {
                  operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
                }
                if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
                  operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
                }
              }
            }
            std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector(&local_50);
            pNVar14 = pNVar14 + 1;
          } while (pNVar14 != local_90);
        }
      }
      std::vector<NDevice,_std::allocator<NDevice>_>::~vector(&local_68);
      return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d8;
    }
    plVar2 = (long *)(local_110 + 0x10);
    local_110._0_8_ = plVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Format: \'ntrode_id\'","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_110);
    if ((long *)local_110._0_8_ != plVar2) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    MlmWrap::getTrodesConfig((TrodesConfig *)local_110,&this->super_MlmWrap);
    TrodesConfig::getNTrodes
              ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)local_d0,(TrodesConfig *)local_110);
    TrodesConfig::~TrodesConfig((TrodesConfig *)local_110);
    uVar18 = local_d0._8_8_;
    if (local_d0._0_8_ != local_d0._8_8_) {
      pNVar14 = (pointer)local_d0._0_8_;
      do {
        NTrodeObj::getId_abi_cxx11_((string *)local_110,(NTrodeObj *)pNVar14);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_d8,(string *)local_110);
        if ((long *)local_110._0_8_ != plVar2) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        pNVar14 = pNVar14 + 1;
      } while (pNVar14 != (pointer)uVar18);
    }
    this_00 = (vector<NDevice,_std::allocator<NDevice>_> *)local_d0;
  }
LAB_001faa46:
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)this_00);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_d8;
}

Assistant:

std::vector<std::string> AbstractModuleClient::getAvailableTrodesData(std::string data){
    std::vector<std::string> list;
    if(data == hfType_NEURO){
        list.push_back("Format: 'ntrode_id, nth channel'");
        for(auto &nt : getTrodesConfig().getNTrodes()){
            for(size_t ch = 0; ch < nt.getHw_chans().size(); ch++){
                list.push_back(nt.getId() + "," + std::to_string(ch+1));
            }
        }
    }
    else if(data == hfType_LFP){
        list.push_back("Format: 'ntrode_id'");
        for(auto &nt : getTrodesConfig().getNTrodes()){
            list.push_back(nt.getId());
        }
    }
    else if(data == hfType_ANALOG){
        list.push_back("Format: 'Device_name, channel_id'");
        for(auto &dv : getTrodesConfig().getDevices()){
            for(auto &ch : dv.getChannels()){
                if(ch.getType() == 1)
                    list.push_back(dv.getName() + "," + ch.getId());
            }
        }
    }
    else if(data == hfType_DIGITAL){
        list.push_back("Format: 'Device_name, channel_id'");
        for(auto &dv : getTrodesConfig().getDevices()){
            for(auto &ch : dv.getChannels()){
                if(ch.getType() == 0)
                    list.push_back(dv.getName() + "," + ch.getId());
            }
        }
    }
    else if(data == hfType_SPIKE){
        list.push_back("Format: 'ntrode_id, cluster'");
        for(auto &nt : getTrodesConfig().getNTrodes()){
            list.push_back(nt.getId() + ", [0-8]");
        }
    }
    return list;
}